

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O1

int wally_ec_public_key_decompress(uchar *pub_key,size_t pub_key_len,uchar *bytes_out,size_t len)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  size_t len_in_out;
  secp256k1_pubkey pub;
  size_t local_60;
  secp256k1_pubkey local_58;
  
  local_60 = 0x41;
  bVar2 = false;
  bVar3 = false;
  if ((((bytes_out != (uchar *)0x0) && (bVar3 = bVar2, pub_key != (uchar *)0x0)) &&
      (pub_key_len == 0x21)) && (len == 0x41)) {
    iVar1 = pubkey_parse(&local_58,pub_key,0x21);
    if (iVar1 != 0) {
      iVar1 = pubkey_serialize(bytes_out,&local_60,&local_58,2);
      if (iVar1 != 0) {
        bVar3 = local_60 == 0x41;
        goto LAB_0010cb2d;
      }
    }
    bVar3 = false;
  }
LAB_0010cb2d:
  if (bytes_out != (uchar *)0x0 && bVar3 == false) {
    wally_clear(bytes_out,len);
  }
  wally_clear(&local_58,0x40);
  return (uint)bVar3 * 2 + -2;
}

Assistant:

int wally_ec_public_key_decompress(const unsigned char *pub_key, size_t pub_key_len,
                                   unsigned char *bytes_out, size_t len)
{
    secp256k1_pubkey pub;
    size_t len_in_out = EC_PUBLIC_KEY_UNCOMPRESSED_LEN;
    bool ok;

    ok = pub_key && pub_key_len == EC_PUBLIC_KEY_LEN &&
         bytes_out && len == EC_PUBLIC_KEY_UNCOMPRESSED_LEN &&
         pubkey_parse(&pub, pub_key, pub_key_len) &&
         pubkey_serialize(bytes_out, &len_in_out, &pub, PUBKEY_UNCOMPRESSED) &&
         len_in_out == EC_PUBLIC_KEY_UNCOMPRESSED_LEN;

    if (!ok && bytes_out)
        wally_clear(bytes_out, len);
    wally_clear(&pub, sizeof(pub));
    return ok ? WALLY_OK : WALLY_EINVAL;
}